

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateSiblings
          (FileGenerator *this,string *package_dir,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list)

{
  char **ppcVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  undefined4 extraout_var;
  FileDescriptor *pFVar6;
  undefined4 extraout_var_00;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  long lVar10;
  undefined1 local_100 [16];
  Descriptor *local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  string filename;
  Printer printer;
  string filename_1;
  ZeroCopyOutputStream *pZVar5;
  
  pFVar6 = this->file_;
  if (*(char *)(*(long *)(pFVar6 + 0x88) + 0x54) == '\x01') {
    local_f0 = (Descriptor *)context;
    local_e8 = file_list;
    local_e0 = package_dir;
    if (0 < *(int *)(pFVar6 + 0x58)) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        lVar2 = *(long *)(pFVar6 + 0x60);
        local_100[0] = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &filename_1,local_e0,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar2 + lVar10));
        plVar4 = (long *)std::__cxx11::string::_M_append((char *)&filename_1,(ulong)local_100);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          printer.buffer_ = (char *)*plVar7;
          printer._24_8_ = plVar4[3];
          printer._0_8_ = &printer.buffer_;
        }
        else {
          printer.buffer_ = (char *)*plVar7;
          printer._0_8_ = (long *)*plVar4;
        }
        printer.output_ = (ZeroCopyOutputStream *)plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append(&printer.variable_delimiter_);
        filename._M_dataplus._M_p = (pointer)&filename.field_2;
        psVar8 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar8) {
          filename.field_2._M_allocated_capacity = *psVar8;
          filename.field_2._8_8_ = plVar4[3];
        }
        else {
          filename.field_2._M_allocated_capacity = *psVar8;
          filename._M_dataplus._M_p = (pointer)*plVar4;
        }
        filename._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((char **)printer._0_8_ != &printer.buffer_) {
          operator_delete((void *)printer._0_8_,(ulong)(printer.buffer_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)filename_1._M_dataplus._M_p != &filename_1.field_2) {
          operator_delete(filename_1._M_dataplus._M_p,filename_1.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_e8,&filename);
        iVar3 = (*(*(_func_int ***)local_f0)[2])(local_f0,&filename);
        pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar3);
        io::Printer::Printer(&printer,pZVar5,'$');
        io::Printer::Print(&printer,
                           "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                           ,"filename",(string *)**(undefined8 **)(lVar2 + 0x10 + lVar10));
        if ((this->java_package_)._M_string_length != 0) {
          io::Printer::Print(&printer,"package $package$;\n\n","package",&this->java_package_);
        }
        EnumGenerator::EnumGenerator
                  ((EnumGenerator *)&filename_1,(EnumDescriptor *)(lVar2 + lVar10));
        EnumGenerator::Generate((EnumGenerator *)&filename_1,&printer);
        EnumGenerator::~EnumGenerator((EnumGenerator *)&filename_1);
        io::Printer::~Printer(&printer);
        if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)filename._M_dataplus._M_p != &filename.field_2) {
          operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
        }
        lVar9 = lVar9 + 1;
        pFVar6 = this->file_;
        lVar10 = lVar10 + 0x38;
      } while (lVar9 < *(int *)(pFVar6 + 0x58));
    }
    if (0 < *(int *)(pFVar6 + 0x48)) {
      ppcVar1 = &printer.buffer_;
      lVar9 = 0;
      lVar10 = 0;
      do {
        printer.buffer_ = (char *)0x65646c697542724f;
        printer.output_ = (ZeroCopyOutputStream *)0x9;
        printer.buffer_size_._0_2_ = 0x72;
        printer._0_8_ = ppcVar1;
        GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                  ((java *)local_e0,&this->java_package_,
                   (string *)(*(long *)(pFVar6 + 0x50) + lVar9),local_f0,
                   (GeneratorContext *)local_e8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&printer,(string *)MessageGenerator::GenerateInterface,0);
        if ((char **)printer._0_8_ != ppcVar1) {
          operator_delete((void *)printer._0_8_,(ulong)(printer.buffer_ + 1));
        }
        printer.output_ = (ZeroCopyOutputStream *)0x0;
        printer.buffer_ = (char *)((ulong)printer.buffer_ & 0xffffffffffffff00);
        printer._0_8_ = ppcVar1;
        GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                  ((java *)local_e0,&this->java_package_,
                   (string *)(*(long *)(this->file_ + 0x50) + lVar9),local_f0,
                   (GeneratorContext *)local_e8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&printer,(string *)MessageGenerator::Generate,0);
        if ((char **)printer._0_8_ != ppcVar1) {
          operator_delete((void *)printer._0_8_,(ulong)(printer.buffer_ + 1));
        }
        lVar10 = lVar10 + 1;
        pFVar6 = this->file_;
        lVar9 = lVar9 + 0x78;
      } while (lVar10 < *(int *)(pFVar6 + 0x48));
    }
    if (((0 < *(int *)(pFVar6 + 0x68)) && (*(int *)(*(long *)(pFVar6 + 0x88) + 0x50) != 3)) &&
       (*(char *)(*(long *)(pFVar6 + 0x88) + 0x57) == '\x01')) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        lVar2 = *(long *)(pFVar6 + 0x70);
        local_100[0] = 0;
        std::operator+(&filename,local_e0,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar2 + lVar10));
        plVar4 = (long *)std::__cxx11::string::_M_append((char *)&filename,(ulong)local_100);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          printer.buffer_ = (char *)*plVar7;
          printer._24_8_ = plVar4[3];
          printer._0_8_ = &printer.buffer_;
        }
        else {
          printer.buffer_ = (char *)*plVar7;
          printer._0_8_ = (long *)*plVar4;
        }
        printer.output_ = (ZeroCopyOutputStream *)plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append(&printer.variable_delimiter_);
        filename_1._M_dataplus._M_p = (pointer)&filename_1.field_2;
        psVar8 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar8) {
          filename_1.field_2._M_allocated_capacity = *psVar8;
          filename_1.field_2._8_8_ = plVar4[3];
        }
        else {
          filename_1.field_2._M_allocated_capacity = *psVar8;
          filename_1._M_dataplus._M_p = (pointer)*plVar4;
        }
        filename_1._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((char **)printer._0_8_ != &printer.buffer_) {
          operator_delete((void *)printer._0_8_,(ulong)(printer.buffer_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)filename._M_dataplus._M_p != &filename.field_2) {
          operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_e8,&filename_1);
        iVar3 = (*(*(_func_int ***)local_f0)[2])(local_f0,&filename_1);
        pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar3);
        io::Printer::Printer(&printer,pZVar5,'$');
        io::Printer::Print(&printer,
                           "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                           ,"filename",(string *)**(undefined8 **)(lVar2 + 0x10 + lVar10));
        if ((this->java_package_)._M_string_length != 0) {
          io::Printer::Print(&printer,"package $package$;\n\n","package",&this->java_package_);
        }
        ServiceGenerator::ServiceGenerator
                  ((ServiceGenerator *)&filename,(ServiceDescriptor *)(lVar2 + lVar10));
        ServiceGenerator::Generate((ServiceGenerator *)&filename,&printer);
        ServiceGenerator::~ServiceGenerator((ServiceGenerator *)&filename);
        io::Printer::~Printer(&printer);
        if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)filename_1._M_dataplus._M_p != &filename_1.field_2) {
          operator_delete(filename_1._M_dataplus._M_p,filename_1.field_2._M_allocated_capacity + 1);
        }
        lVar9 = lVar9 + 1;
        pFVar6 = this->file_;
        lVar10 = lVar10 + 0x30;
      } while (lVar9 < *(int *)(pFVar6 + 0x68));
    }
  }
  return;
}

Assistant:

void FileGenerator::GenerateSiblings(const string& package_dir,
                                     GeneratorContext* context,
                                     vector<string>* file_list) {
  if (file_->options().java_multiple_files()) {
    for (int i = 0; i < file_->enum_type_count(); i++) {
      GenerateSibling<EnumGenerator>(package_dir, java_package_,
                                     file_->enum_type(i),
                                     context, file_list, "",
                                     &EnumGenerator::Generate);
    }
    for (int i = 0; i < file_->message_type_count(); i++) {
      GenerateSibling<MessageGenerator>(package_dir, java_package_,
                                        file_->message_type(i),
                                        context, file_list, "OrBuilder",
                                        &MessageGenerator::GenerateInterface);
      GenerateSibling<MessageGenerator>(package_dir, java_package_,
                                        file_->message_type(i),
                                        context, file_list, "",
                                        &MessageGenerator::Generate);
    }
    if (HasGenericServices(file_)) {
      for (int i = 0; i < file_->service_count(); i++) {
        GenerateSibling<ServiceGenerator>(package_dir, java_package_,
                                          file_->service(i),
                                          context, file_list, "",
                                          &ServiceGenerator::Generate);
      }
    }
  }
}